

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

optional<long>
SelectNodeToEvict(vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                  *vEvictionCandidates)

{
  long lVar1;
  pointer pNVar2;
  value_type *pvVar3;
  long lVar4;
  value_type *pvVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long lVar8;
  value_type *pvVar9;
  const_iterator __first;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  code *pcVar11;
  long lVar12;
  value_type *pvVar13;
  value_type *pvVar14;
  long lVar15;
  long lVar16;
  const_iterator __last;
  ulong uVar17;
  uint64_t *__k;
  long in_FS_OFFSET;
  byte bVar18;
  optional<long> oVar19;
  uint64_t naMostConnections;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
  mapNetGroupNodes;
  
  bVar18 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProtectNoBanConnections(vEvictionCandidates);
  ProtectOutboundConnections(vEvictionCandidates);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  pcVar11 = std::
            _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
            ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNetGroupKeyed,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,ReverseCompareNodeMinPingTime,8,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeTXTime,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:197:24)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:197:24)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeBlockRelayOnlyTime,8,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeBlockTime,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  ProtectEvictionCandidatesByRatio(vEvictionCandidates);
  pvVar5 = (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (vEvictionCandidates->
       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (pvVar5 == __last._M_current) {
    uVar10 = 0;
    goto LAB_001f898a;
  }
  lVar8 = (long)__last._M_current - (long)pvVar5;
  lVar15 = 0x38;
  lVar16 = 0;
  lVar12 = lVar8 / 0x48 >> 2;
  for (lVar4 = lVar12; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (*(char *)((long)&pvVar5->id + lVar15) != '\0') {
      pvVar9 = (value_type *)((long)pvVar5 - lVar16);
      goto LAB_001f87db;
    }
    if (*(char *)((long)&pvVar5[1].id + lVar15) != '\0') {
      pvVar9 = (value_type *)((long)pvVar5 + (0x48 - lVar16));
      goto LAB_001f87db;
    }
    if (*(char *)((long)&pvVar5[2].id + lVar15) != '\0') {
      pvVar9 = (value_type *)((long)pvVar5 + (0x90 - lVar16));
      goto LAB_001f87db;
    }
    if (*(char *)((long)&pvVar5[3].id + lVar15) != '\0') {
      pvVar9 = (value_type *)((long)pvVar5 + (0xd8 - lVar16));
      goto LAB_001f87db;
    }
    lVar16 = lVar16 + -0x120;
    lVar15 = lVar15 + 0x120;
  }
  lVar4 = (lVar8 + lVar16) / 0x48;
  pvVar9 = (value_type *)((long)pvVar5 - lVar16);
  if (lVar4 == 1) {
LAB_001f89ce:
    if (pvVar9->prefer_evict == false) {
      pvVar9 = __last._M_current;
    }
LAB_001f87db:
    if (pvVar9 != __last._M_current) {
      pvVar5 = pvVar5 + 2;
      for (; 0 < lVar12; lVar12 = lVar12 + -1) {
        if (pvVar5[-2].prefer_evict != true) {
          pvVar9 = pvVar5 + -2;
          goto LAB_001f8875;
        }
        if (pvVar5[-1].prefer_evict != true) {
          pvVar9 = pvVar5 + -1;
          goto LAB_001f8875;
        }
        pvVar9 = pvVar5;
        if (pvVar5->prefer_evict != true) goto LAB_001f8875;
        if (pvVar5[1].prefer_evict != true) {
          pvVar9 = pvVar5 + 1;
          goto LAB_001f8875;
        }
        pvVar5 = pvVar5 + 4;
        lVar8 = lVar8 + -0x120;
      }
      lVar8 = lVar8 / 0x48;
      pvVar9 = pvVar5 + -2;
      if (lVar8 == 1) {
LAB_001f8a06:
        if (pvVar9->prefer_evict != false) {
          pvVar9 = __last._M_current;
        }
LAB_001f8875:
        __first._M_current = pvVar9;
        if (pvVar9 != __last._M_current) {
          pvVar5 = pvVar9;
          while (pvVar13 = pvVar5 + 1, pvVar13 != __last._M_current) {
            pvVar3 = pvVar5 + 1;
            pvVar5 = pvVar13;
            lVar15 = 9;
            pvVar14 = pvVar9;
            if (pvVar3->prefer_evict == true) {
              for (; lVar15 != 0; lVar15 = lVar15 + -1) {
                pvVar14->id = pvVar13->id;
                pvVar13 = (value_type *)((long)pvVar13 + (ulong)bVar18 * -0x10 + 8);
                pvVar14 = (value_type *)((long)pvVar14 + (ulong)bVar18 * -0x10 + 8);
              }
              pvVar9 = pvVar9 + 1;
            }
          }
          __last._M_current =
               (vEvictionCandidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          __first._M_current = pvVar9;
        }
      }
      else {
        if (lVar8 == 3) {
          if (pvVar5[-2].prefer_evict == true) {
            pvVar9 = pvVar5 + -1;
            goto LAB_001f89f1;
          }
          goto LAB_001f8875;
        }
        __first._M_current = __last._M_current;
        if (lVar8 == 2) {
LAB_001f89f1:
          if (pvVar9->prefer_evict == true) {
            pvVar9 = pvVar9 + 1;
            goto LAB_001f8a06;
          }
          goto LAB_001f8875;
        }
      }
      std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::erase
                (vEvictionCandidates,__first,__last);
      pvVar5 = (vEvictionCandidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    if (lVar4 == 2) {
LAB_001f89ba:
      if (pvVar9->prefer_evict == false) {
        pvVar9 = pvVar9 + 1;
        goto LAB_001f89ce;
      }
      goto LAB_001f87db;
    }
    if (lVar4 == 3) {
      if (*(char *)((long)&pvVar5->id + lVar15) == '\0') {
        pvVar9 = (value_type *)((long)pvVar5 + (0x48 - lVar16));
        goto LAB_001f89ba;
      }
      goto LAB_001f87db;
    }
  }
  mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header;
  mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar15 = 0;
  uVar17 = 0;
  mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapNetGroupNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__k = &pvVar5->nKeyedNetGroup; (value_type *)(__k + -6) != __last._M_current; __k = __k + 9)
  {
    pmVar6 = std::
             map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
             ::operator[](&mapNetGroupNodes,__k);
    std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::push_back
              (pmVar6,(value_type *)(__k + -6));
    pNVar2 = (pmVar6->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (pNVar2->m_connected).__r;
    uVar7 = ((long)(pmVar6->
                   super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) / 0x48;
    if ((uVar17 < uVar7) || ((uVar7 == uVar17 && (lVar15 < lVar4)))) {
      naMostConnections = *__k;
      uVar17 = uVar7 & 0xffffffff;
      lVar15 = lVar4;
    }
  }
  pmVar6 = std::
           map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
           ::operator[](&mapNetGroupNodes,&naMostConnections);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::_M_move_assign
            (vEvictionCandidates,pmVar6);
  pcVar11 = (code *)((_Storage<long,_true> *)
                    (vEvictionCandidates->
                    super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                    )._M_impl.super__Vector_impl_data._M_start)->_M_value;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
  ::~_Rb_tree(&mapNetGroupNodes._M_t);
  uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_001f898a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  oVar19.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
       = uVar10;
  oVar19.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)(_Storage<long,_true>)pcVar11;
  return (optional<long>)
         oVar19.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
  ;
}

Assistant:

[[nodiscard]] std::optional<NodeId> SelectNodeToEvict(std::vector<NodeEvictionCandidate>&& vEvictionCandidates)
{
    // Protect connections with certain characteristics

    ProtectNoBanConnections(vEvictionCandidates);

    ProtectOutboundConnections(vEvictionCandidates);

    // Deterministically select 4 peers to protect by netgroup.
    // An attacker cannot predict which netgroups will be protected
    EraseLastKElements(vEvictionCandidates, CompareNetGroupKeyed, 4);
    // Protect the 8 nodes with the lowest minimum ping time.
    // An attacker cannot manipulate this metric without physically moving nodes closer to the target.
    EraseLastKElements(vEvictionCandidates, ReverseCompareNodeMinPingTime, 8);
    // Protect 4 nodes that most recently sent us novel transactions accepted into our mempool.
    // An attacker cannot manipulate this metric without performing useful work.
    EraseLastKElements(vEvictionCandidates, CompareNodeTXTime, 4);
    // Protect up to 8 non-tx-relay peers that have sent us novel blocks.
    EraseLastKElements(vEvictionCandidates, CompareNodeBlockRelayOnlyTime, 8,
                       [](const NodeEvictionCandidate& n) { return !n.m_relay_txs && n.fRelevantServices; });

    // Protect 4 nodes that most recently sent us novel blocks.
    // An attacker cannot manipulate this metric without performing useful work.
    EraseLastKElements(vEvictionCandidates, CompareNodeBlockTime, 4);

    // Protect some of the remaining eviction candidates by ratios of desirable
    // or disadvantaged characteristics.
    ProtectEvictionCandidatesByRatio(vEvictionCandidates);

    if (vEvictionCandidates.empty()) return std::nullopt;

    // If any remaining peers are preferred for eviction consider only them.
    // This happens after the other preferences since if a peer is really the best by other criteria (esp relaying blocks)
    //  then we probably don't want to evict it no matter what.
    if (std::any_of(vEvictionCandidates.begin(),vEvictionCandidates.end(),[](NodeEvictionCandidate const &n){return n.prefer_evict;})) {
        vEvictionCandidates.erase(std::remove_if(vEvictionCandidates.begin(),vEvictionCandidates.end(),
                                  [](NodeEvictionCandidate const &n){return !n.prefer_evict;}),vEvictionCandidates.end());
    }

    // Identify the network group with the most connections and youngest member.
    // (vEvictionCandidates is already sorted by reverse connect time)
    uint64_t naMostConnections;
    unsigned int nMostConnections = 0;
    std::chrono::seconds nMostConnectionsTime{0};
    std::map<uint64_t, std::vector<NodeEvictionCandidate> > mapNetGroupNodes;
    for (const NodeEvictionCandidate &node : vEvictionCandidates) {
        std::vector<NodeEvictionCandidate> &group = mapNetGroupNodes[node.nKeyedNetGroup];
        group.push_back(node);
        const auto grouptime{group[0].m_connected};

        if (group.size() > nMostConnections || (group.size() == nMostConnections && grouptime > nMostConnectionsTime)) {
            nMostConnections = group.size();
            nMostConnectionsTime = grouptime;
            naMostConnections = node.nKeyedNetGroup;
        }
    }

    // Reduce to the network group with the most connections
    vEvictionCandidates = std::move(mapNetGroupNodes[naMostConnections]);

    // Disconnect from the network group with the most connections
    return vEvictionCandidates.front().id;
}